

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O3

void __thiscall
S98Player::RefreshMuting(S98Player *this,S98_CHIPDEV *chipDev,PLR_MUTE_OPTS *muteOpts)

{
  DEV_DATA *pDVar1;
  DEVFUNC_OPTMASK p_Var2;
  bool bVar3;
  byte bVar4;
  DEV_INFO *devInf;
  
  bVar4 = 1;
  do {
    pDVar1 = (chipDev->base).defInf.dataPtr;
    if ((pDVar1 != (DEV_DATA *)0x0) &&
       (p_Var2 = ((chipDev->base).defInf.devDef)->SetMuteMask, p_Var2 != (DEVFUNC_OPTMASK)0x0)) {
      (*p_Var2)(pDVar1,muteOpts->chnMute[0]);
    }
    chipDev = (S98_CHIPDEV *)(chipDev->base).linkDev;
    bVar3 = (bool)(chipDev != (S98_CHIPDEV *)0x0 & bVar4);
    bVar4 = 0;
  } while (bVar3);
  return;
}

Assistant:

void S98Player::RefreshMuting(S98_CHIPDEV& chipDev, const PLR_MUTE_OPTS& muteOpts)
{
	VGM_BASEDEV* clDev;
	UINT8 linkCntr = 0;
	
	for (clDev = &chipDev.base; clDev != NULL && linkCntr < 2; clDev = clDev->linkDev, linkCntr ++)
	{
		DEV_INFO* devInf = &clDev->defInf;
		if (devInf->dataPtr != NULL && devInf->devDef->SetMuteMask != NULL)
			devInf->devDef->SetMuteMask(devInf->dataPtr, muteOpts.chnMute[0]);
	}
	
	return;
}